

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void once_init(void)

{
  AsyncLogging *this;
  string local_38;
  
  this = (AsyncLogging *)operator_new(0x1f8);
  Logger::getLogFileName_abi_cxx11_();
  AsyncLogging::AsyncLogging(this,&local_38,2);
  AsyncLogger_ = this;
  std::__cxx11::string::~string((string *)&local_38);
  AsyncLogging::start(AsyncLogger_);
  return;
}

Assistant:

void once_init()
{
    AsyncLogger_ = new AsyncLogging(Logger::getLogFileName());
    AsyncLogger_->start(); 
}